

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void QApplicationPrivate::setSystemFont(QFont *font)

{
  QFont *this;
  
  if (sys_font == (QFont *)0x0) {
    this = (QFont *)operator_new(0x10);
    QFont::QFont(this,font);
    sys_font = this;
  }
  else {
    QFont::operator=(sys_font,font);
  }
  if (set_font != (QFont *)0x0) {
    return;
  }
  QApplication::setFont(sys_font,(char *)0x0);
  return;
}

Assistant:

void QApplicationPrivate::setSystemFont(const QFont &font)
{
     if (!sys_font)
        sys_font = new QFont(font);
    else
        *sys_font = font;

    if (!QApplicationPrivate::set_font)
        QApplication::setFont(*sys_font);
}